

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryHeap.hpp
# Opt level: O0

void __thiscall
Lib::
BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Rhs>_>
::~BinaryHeap(BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::SuperpositionConf::Rhs>_>
              *this)

{
  uint *in_RDI;
  UnresolvedSplitRecord *ep;
  long local_10;
  
  if (*(long *)(in_RDI + 2) != 0) {
    for (local_10 = *(long *)(in_RDI + 2) + (ulong)*in_RDI * 0x10; local_10 != *(long *)(in_RDI + 4)
        ; local_10 = local_10 + -0x10) {
    }
    Lib::free(*(void **)(in_RDI + 2));
  }
  return;
}

Assistant:

~BinaryHeap()
  {
    if(_data) {
      T* ep=_data+_size;
      while(ep!=_data1) {
	(--ep)->~T();
      }
      DEALLOC_KNOWN(_data,_capacity*sizeof(T),"BinaryHeap::T");
    }
  }